

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O0

void test_ack_decode(void)

{
  int iVar1;
  quicly_ack_frame_t decoded_2;
  uint64_t range_sum;
  uint64_t i;
  uint8_t *src_2;
  uint8_t *end;
  uint8_t pat_2 [1024];
  quicly_ack_frame_t decoded_1;
  uint8_t *src_1;
  uint8_t pat_1 [8];
  quicly_ack_frame_t decoded;
  uint8_t *src;
  uint8_t pat [4];
  _func_void *in_stack_ffffffffffffcb38;
  uint8_t *in_stack_ffffffffffffcb40;
  long local_34b8;
  undefined4 local_34b0;
  int in_stack_ffffffffffffcb54;
  quicly_ack_frame_t *in_stack_ffffffffffffcb58;
  uint8_t *in_stack_ffffffffffffcb60;
  uint8_t **in_stack_ffffffffffffcb68;
  long alStack_2c98 [256];
  uint8_t *local_2498;
  quicly_ack_frame_t *local_2490;
  uint8_t *local_2488;
  uint8_t *local_2480;
  uint8_t local_2478 [1032];
  long local_2070;
  long local_2068;
  long local_2058;
  long local_2050;
  long local_2048;
  long local_2040;
  long local_1848;
  long local_1840;
  long *local_1048;
  long local_1040;
  long local_1038;
  long local_1030;
  long local_1020;
  long local_1018;
  undefined4 *local_10;
  undefined4 local_4;
  
  local_4 = 0x11000034;
  local_10 = &local_4;
  iVar1 = quicly_decode_ack_frame
                    (in_stack_ffffffffffffcb68,in_stack_ffffffffffffcb60,in_stack_ffffffffffffcb58,
                     in_stack_ffffffffffffcb54);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x45)
  ;
  _ok((int)(ulong)(local_10 == (undefined4 *)&stack0x00000000),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x46)
  ;
  _ok((int)(ulong)(local_1038 == 0x34),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x47)
  ;
  _ok((int)(ulong)(local_1020 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x48)
  ;
  _ok((int)(ulong)(local_1018 == 0x12),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x49)
  ;
  _ok((int)(ulong)(local_1030 == 0x23),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x4a)
  ;
  local_1040 = 0x403020100020034;
  local_1048 = &local_1040;
  iVar1 = quicly_decode_ack_frame
                    (in_stack_ffffffffffffcb68,in_stack_ffffffffffffcb60,in_stack_ffffffffffffcb58,
                     in_stack_ffffffffffffcb54);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x50)
  ;
  _ok((int)(ulong)(local_1048 == &local_1038),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x51)
  ;
  _ok((int)(ulong)(local_2070 == 0x34),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x52)
  ;
  _ok((int)(ulong)(local_2058 == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x53)
  ;
  _ok((int)(ulong)(local_2050 == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x54)
  ;
  _ok((int)(ulong)(local_1848 == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x55)
  ;
  _ok((int)(ulong)(local_2048 == 3),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x56)
  ;
  _ok((int)(ulong)(local_1840 == 4),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x57)
  ;
  _ok((int)(ulong)(local_2040 == 5),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x58)
  ;
  _ok((int)(ulong)(local_2068 == 0x26),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x59)
  ;
  local_2480 = local_2478;
  local_2488 = local_2478;
  local_2480 = ptls_encode_quicint(in_stack_ffffffffffffcb40,(uint64_t)in_stack_ffffffffffffcb38);
  local_2480 = ptls_encode_quicint(in_stack_ffffffffffffcb40,(uint64_t)in_stack_ffffffffffffcb38);
  local_2480 = ptls_encode_quicint(in_stack_ffffffffffffcb40,(uint64_t)in_stack_ffffffffffffcb38);
  local_2480 = ptls_encode_quicint(in_stack_ffffffffffffcb40,(uint64_t)in_stack_ffffffffffffcb38);
  for (local_2490 = (quicly_ack_frame_t *)0x0; local_2490 < 0x11e;
      local_2490 = (quicly_ack_frame_t *)((long)local_2490 + 1)) {
    local_2480 = ptls_encode_quicint(in_stack_ffffffffffffcb40,(uint64_t)in_stack_ffffffffffffcb38);
    local_2480 = ptls_encode_quicint(in_stack_ffffffffffffcb40,(uint64_t)in_stack_ffffffffffffcb38);
  }
  iVar1 = quicly_decode_ack_frame
                    (in_stack_ffffffffffffcb68,in_stack_ffffffffffffcb60,in_stack_ffffffffffffcb58,
                     in_stack_ffffffffffffcb54);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6a)
  ;
  _ok((int)(ulong)(in_stack_ffffffffffffcb40 == (uint8_t *)0xfa00),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6b)
  ;
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffcb54,local_34b0) == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6c)
  ;
  _ok((int)(ulong)(in_stack_ffffffffffffcb58 == (quicly_ack_frame_t *)0x100),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6d)
  ;
  _ok((int)(ulong)(in_stack_ffffffffffffcb60 == (uint8_t *)0x9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6e)
  ;
  local_2498 = in_stack_ffffffffffffcb60;
  for (local_2490 = (quicly_ack_frame_t *)0x0; local_2490 < in_stack_ffffffffffffcb58;
      local_2490 = (quicly_ack_frame_t *)((long)&local_2490->largest_acknowledged + 1)) {
    _ok((int)(ulong)((undefined1 *)alStack_2c98[(long)local_2490] ==
                    (undefined1 *)((long)&local_2490->largest_acknowledged + 1)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",
        0x71);
    in_stack_ffffffffffffcb38 = *(_func_void **)(&stack0xffffffffffffcb68 + (long)local_2490 * 8);
    _ok((int)(ulong)(in_stack_ffffffffffffcb38 == (_func_void *)((ulong)local_2490 % 10 + 1)),
        "%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",
        0x72);
    local_2498 = local_2498 +
                 alStack_2c98[(long)local_2490] +
                 *(long *)(&stack0xffffffffffffcb68 + (long)local_2490 * 8);
  }
  _ok((int)(ulong)(local_2488 == local_2480),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x75)
  ;
  _ok((int)(ulong)(local_34b8 == 0xfa01 - (long)local_2498),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x76)
  ;
  subtest((char *)in_stack_ffffffffffffcb40,in_stack_ffffffffffffcb38);
  return;
}

Assistant:

static void test_ack_decode(void)
{
    {
        const uint8_t pat[] = {0x34, 0x00, 0x00, 0x11}, *src = pat;
        quicly_ack_frame_t decoded;
        ok(quicly_decode_ack_frame(&src, pat + sizeof(pat), &decoded, 0) == 0);
        ok(src == pat + sizeof(pat));
        ok(decoded.largest_acknowledged == 0x34);
        ok(decoded.num_gaps == 0);
        ok(decoded.ack_block_lengths[0] == 0x12);
        ok(decoded.smallest_acknowledged == 0x34 - 0x12 + 1);
    }

    {
        const uint8_t pat[] = {0x34, 0x00, 0x02, 0x00, 0x01, 0x02, 0x03, 0x04}, *src = pat;
        quicly_ack_frame_t decoded;
        ok(quicly_decode_ack_frame(&src, pat + sizeof(pat), &decoded, 0) == 0);
        ok(src == pat + sizeof(pat));
        ok(decoded.largest_acknowledged == 0x34);
        ok(decoded.num_gaps == 2);
        ok(decoded.ack_block_lengths[0] == 1);
        ok(decoded.gaps[0] == 2);
        ok(decoded.ack_block_lengths[1] == 3);
        ok(decoded.gaps[1] == 4);
        ok(decoded.ack_block_lengths[2] == 5);
        ok(decoded.smallest_acknowledged == 0x34 - 1 - 2 - 3 - 4 - 5 + 1);
    }

    { /* Bogus ACK Frame larger than the internal buffer */
        uint8_t pat[1024], *end = pat;
        const uint8_t *src = pat;
        uint64_t i, range_sum;
        quicly_ack_frame_t decoded;
        end = quicly_encodev(end, 0xFA00);
        end = quicly_encodev(end, 0);
        end = quicly_encodev(end, QUICLY_ACK_MAX_GAPS + 30); // with excess ranges
        end = quicly_encodev(end, 8);
        for (i = 0; i < QUICLY_ACK_MAX_GAPS + 30; ++i) {
            end = quicly_encodev(end, i);      // gap
            end = quicly_encodev(end, i % 10); // ack-range
        }

        ok(quicly_decode_ack_frame(&src, end, &decoded, 0) == 0);
        ok(decoded.largest_acknowledged == 0xFA00);
        ok(decoded.ack_delay == 0);
        ok(decoded.num_gaps == QUICLY_ACK_MAX_GAPS);
        ok(decoded.ack_block_lengths[0] == 8 + 1); // first ack-range
        range_sum = decoded.ack_block_lengths[0];
        for (i = 0; i < decoded.num_gaps; ++i) {
            ok(decoded.gaps[i] == i + 1);
            ok(decoded.ack_block_lengths[i + 1] == (i % 10) + 1);
            range_sum += decoded.gaps[i] + decoded.ack_block_lengths[i + 1];
        }
        ok(src == end); // decoded the entire frame
        ok(decoded.smallest_acknowledged == 0xFA00 - range_sum + 1);
    }

    subtest("underflow", test_ack_decode_underflow);
}